

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GenImageCellular(Image *__return_storage_ptr__,int width,int height,int tileSize)

{
  undefined8 uVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *__ptr;
  undefined1 uVar8;
  double dVar9;
  double dVar10;
  undefined4 local_7c;
  int local_78;
  int intensity;
  float dist;
  Vector2 neighborSeed;
  int j;
  int i_1;
  float minDistance;
  int tileX;
  int x_1;
  int tileY;
  int y_1;
  int x;
  int y;
  int i;
  Vector2 *seeds;
  int seedsCount;
  int seedsPerCol;
  int seedsPerRow;
  Color *pixels;
  int tileSize_local;
  int height_local;
  int width_local;
  
  pvVar7 = malloc((long)(width * height) << 2);
  iVar3 = width / tileSize;
  iVar4 = iVar3 * (height / tileSize);
  __ptr = malloc((long)iVar4 << 3);
  for (x = 0; x < iVar4; x = x + 1) {
    iVar5 = GetRandomValue(0,tileSize + -1);
    iVar6 = GetRandomValue(0,tileSize + -1);
    *(ulong *)((long)__ptr + (long)x * 8) =
         CONCAT44((float)((x / iVar3) * tileSize + iVar5),(float)((x % iVar3) * tileSize + iVar6));
  }
  for (x_1 = 0; x_1 < height; x_1 = x_1 + 1) {
    iVar4 = x_1 / tileSize;
    for (minDistance = 0.0; (int)minDistance < width; minDistance = (float)((int)minDistance + 1)) {
      iVar5 = (int)minDistance / tileSize;
      dVar9 = strtod("Inf",(char **)0x0);
      j = (int)(float)dVar9;
      for (neighborSeed.y = -NAN; (int)neighborSeed.y < 2;
          neighborSeed.y = (float)((int)neighborSeed.y + 1)) {
        if ((-1 < iVar5 + (int)neighborSeed.y) && (iVar5 + (int)neighborSeed.y < iVar3)) {
          for (neighborSeed.x = -NAN; (int)neighborSeed.x < 2;
              neighborSeed.x = (float)((int)neighborSeed.x + 1)) {
            if ((-1 < iVar4 + (int)neighborSeed.x) &&
               (iVar4 + (int)neighborSeed.x < height / tileSize)) {
              uVar1 = *(undefined8 *)
                       ((long)__ptr +
                       (long)((iVar4 + (int)neighborSeed.x) * iVar3 + iVar5 + (int)neighborSeed.y) *
                       8);
              intensity = (int)uVar1;
              dist = (float)((ulong)uVar1 >> 0x20);
              dVar9 = hypot((double)((int)minDistance - (int)(float)intensity),
                            (double)(x_1 - (int)dist));
              dVar10 = (double)(float)j;
              dVar9 = (double)(float)dVar9;
              dVar2 = dVar9;
              if (dVar10 <= dVar9) {
                dVar2 = dVar10;
              }
              j = (int)(float)(double)(~-(ulong)NAN(dVar10) & (ulong)dVar2 |
                                      -(ulong)NAN(dVar10) & (ulong)dVar9);
            }
          }
        }
      }
      local_78 = (int)(((float)j * 256.0) / (float)tileSize);
      if (0xff < local_78) {
        local_78 = 0xff;
      }
      uVar8 = (undefined1)local_78;
      local_7c = CONCAT13(0xff,CONCAT12(uVar8,CONCAT11(uVar8,uVar8)));
      *(undefined4 *)((long)pvVar7 + (long)(x_1 * width + (int)minDistance) * 4) = local_7c;
    }
  }
  free(__ptr);
  __return_storage_ptr__->data = pvVar7;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageCellular(int width, int height, int tileSize)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    int seedsPerRow = width/tileSize;
    int seedsPerCol = height/tileSize;
    int seedsCount = seedsPerRow*seedsPerCol;

    Vector2 *seeds = (Vector2 *)RL_MALLOC(seedsCount*sizeof(Vector2));

    for (int i = 0; i < seedsCount; i++)
    {
        int y = (i/seedsPerRow)*tileSize + GetRandomValue(0, tileSize - 1);
        int x = (i%seedsPerRow)*tileSize + GetRandomValue(0, tileSize - 1);
        seeds[i] = (Vector2){ (float)x, (float)y};
    }

    for (int y = 0; y < height; y++)
    {
        int tileY = y/tileSize;

        for (int x = 0; x < width; x++)
        {
            int tileX = x/tileSize;

            float minDistance = (float)strtod("Inf", NULL);

            // Check all adjacent tiles
            for (int i = -1; i < 2; i++)
            {
                if ((tileX + i < 0) || (tileX + i >= seedsPerRow)) continue;

                for (int j = -1; j < 2; j++)
                {
                    if ((tileY + j < 0) || (tileY + j >= seedsPerCol)) continue;

                    Vector2 neighborSeed = seeds[(tileY + j)*seedsPerRow + tileX + i];

                    float dist = (float)hypot(x - (int)neighborSeed.x, y - (int)neighborSeed.y);
                    minDistance = (float)fmin(minDistance, dist);
                }
            }

            // I made this up but it seems to give good results at all tile sizes
            int intensity = (int)(minDistance*256.0f/tileSize);
            if (intensity > 255) intensity = 255;

            pixels[y*width + x] = (Color){ intensity, intensity, intensity, 255 };
        }
    }

    RL_FREE(seeds);

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}